

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argvParser.cpp
# Opt level: O0

argvParser * __thiscall argvParser::generateMarkdownArgumentOverview_abi_cxx11_(argvParser *this)

{
  bool bVar1;
  size_type sVar2;
  reference ppsVar3;
  reference ppaVar4;
  ulong uVar5;
  long in_RSI;
  string local_2e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0 [32];
  __cxx11 local_2a0 [32];
  string local_280 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260 [32];
  string local_240 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220 [32];
  string local_200 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0 [32];
  string local_180 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160 [32];
  value_type local_140;
  argument *arg_1;
  string local_130 [4];
  int x_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110 [36];
  int local_ec;
  string local_e8 [4];
  int i_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8 [32];
  value_type local_a8;
  argument *arg;
  int local_98;
  int x;
  int i;
  bool hasReq;
  string req;
  string local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [54];
  allocator local_1a;
  byte local_19;
  argvParser *this_local;
  string *md;
  
  local_19 = 0;
  this_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,"",&local_1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  std::operator+((char *)local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1172c0);
  std::operator+(local_50,(char *)local_70);
  std::__cxx11::string::operator+=((string *)this,(string *)local_50);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&i,"## Required arguments: \n",(allocator *)((long)&x + 3))
  ;
  std::allocator<char>::~allocator((allocator<char> *)((long)&x + 3));
  x._2_1_ = 0;
  for (local_98 = 0; uVar5 = (ulong)local_98,
      sVar2 = std::
              vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
              ::size(*(vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                       **)(in_RSI + 0x60)), uVar5 < sVar2; local_98 = local_98 + 1) {
    arg._4_4_ = 0;
    while( true ) {
      uVar5 = (ulong)arg._4_4_;
      ppsVar3 = std::
                vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                ::at(*(vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                       **)(in_RSI + 0x60),(long)local_98);
      sVar2 = std::
              vector<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
              ::size((*ppsVar3)->arguments);
      if (sVar2 <= uVar5) break;
      ppsVar3 = std::
                vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                ::at(*(vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                       **)(in_RSI + 0x60),(long)local_98);
      ppaVar4 = std::
                vector<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                ::at((*ppsVar3)->arguments,(long)arg._4_4_);
      local_a8 = *ppaVar4;
      if ((local_a8->requiredAndNotHitJet & 1U) != 0) {
        if ((x._2_1_ & 1) == 0) {
          x._2_1_ = 1;
          std::__cxx11::string::operator+=((string *)this,(string *)&i);
        }
        std::operator+((char *)local_e8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" * ");
        std::operator+(local_c8,(char *)local_e8);
        std::__cxx11::string::operator+=((string *)this,(string *)local_c8);
        std::__cxx11::string::~string((string *)local_c8);
        std::__cxx11::string::~string(local_e8);
      }
      arg._4_4_ = arg._4_4_ + 1;
    }
  }
  std::__cxx11::string::operator+=((string *)this,"## Application Arguments \n");
  for (local_ec = 0; uVar5 = (ulong)local_ec,
      sVar2 = std::
              vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
              ::size(*(vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                       **)(in_RSI + 0x60)), uVar5 < sVar2; local_ec = local_ec + 1) {
    std::
    vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
    ::at(*(vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
           **)(in_RSI + 0x60),(long)local_ec);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      std::
      vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
      ::at(*(vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
             **)(in_RSI + 0x60),(long)local_ec);
      std::operator+((char *)local_130,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1172be);
      std::operator+(local_110,(char *)local_130);
      std::__cxx11::string::operator+=((string *)this,(string *)local_110);
      std::__cxx11::string::~string((string *)local_110);
      std::__cxx11::string::~string(local_130);
    }
    arg_1._4_4_ = 0;
    while( true ) {
      uVar5 = (ulong)arg_1._4_4_;
      ppsVar3 = std::
                vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                ::at(*(vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                       **)(in_RSI + 0x60),(long)local_ec);
      sVar2 = std::
              vector<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
              ::size((*ppsVar3)->arguments);
      if (sVar2 <= uVar5) break;
      ppsVar3 = std::
                vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                ::at(*(vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                       **)(in_RSI + 0x60),(long)local_ec);
      ppaVar4 = std::
                vector<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                ::at((*ppsVar3)->arguments,(long)arg_1._4_4_);
      local_140 = *ppaVar4;
      std::operator+((char *)local_180,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"#### ");
      std::operator+(local_160,(char *)local_180);
      std::__cxx11::string::operator+=((string *)this,(string *)local_160);
      std::__cxx11::string::~string((string *)local_160);
      std::__cxx11::string::~string(local_180);
      std::operator+(local_1a0,(char *)&local_140->helpMessage);
      std::__cxx11::string::operator+=((string *)this,(string *)local_1a0);
      std::__cxx11::string::~string((string *)local_1a0);
      std::operator+(local_1c0,(char *)&local_140->additionalHelp);
      std::__cxx11::string::operator+=((string *)this,(string *)local_1c0);
      std::__cxx11::string::~string((string *)local_1c0);
      std::operator+((char *)local_200,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "    short: ");
      std::operator+(local_1e0,(char *)local_200);
      std::__cxx11::string::operator+=((string *)this,(string *)local_1e0);
      std::__cxx11::string::~string((string *)local_1e0);
      std::__cxx11::string::~string(local_200);
      std::operator+((char *)local_240,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "    long : ");
      std::operator+(local_220,(char *)local_240);
      std::__cxx11::string::operator+=((string *)this,(string *)local_220);
      std::__cxx11::string::~string((string *)local_220);
      std::__cxx11::string::~string(local_240);
      if (0 < local_140->numberOfArguments) {
        std::__cxx11::to_string(local_2a0,local_140->numberOfArguments);
        std::operator+((char *)local_280,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "number of additional parameter: ");
        std::operator+(local_260,(char *)local_280);
        std::__cxx11::string::operator+=((string *)this,(string *)local_260);
        std::__cxx11::string::~string((string *)local_260);
        std::__cxx11::string::~string(local_280);
        std::__cxx11::string::~string((string *)local_2a0);
      }
      bVar1 = std::operator!=(&local_140->enums,"");
      if (bVar1) {
        std::operator+((char *)local_2e0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "allowed parameter: ");
        std::operator+(local_2c0,(char *)local_2e0);
        std::__cxx11::string::operator+=((string *)this,(string *)local_2c0);
        std::__cxx11::string::~string((string *)local_2c0);
        std::__cxx11::string::~string(local_2e0);
      }
      if ((local_140->requiredAndNotHitJet & 1U) != 0) {
        std::__cxx11::string::operator+=((string *)this,"This argument is requires \n");
      }
      arg_1._4_4_ = arg_1._4_4_ + 1;
    }
  }
  local_19 = 1;
  std::__cxx11::string::~string((string *)&i);
  if ((local_19 & 1) == 0) {
    std::__cxx11::string::~string((string *)this);
  }
  return this;
}

Assistant:

string argvParser::generateMarkdownArgumentOverview() {

  string md = "";

  md += "# "+ applicationName + "\n";
    string req =  "## Required arguments: \n";
    bool hasReq = false;

  for(int i = 0; i< newargconfig->size();i++) {
      for(int x = 0; x< newargconfig->at(i)->arguments->size();x++) {
          argument * arg = newargconfig->at(i)->arguments->at(x);
          if(arg->requiredAndNotHitJet){
              if(!hasReq){
                  hasReq = true;
                  md += req;
              }
              md += " * " +  arg->argLong + "\n";
          }
    }
  }
  md+= "## Application Arguments \n";
      for(int i = 0; i< newargconfig->size();i++) {
          if (!newargconfig->at(i)->sectionName.empty()) {
              md += "### " + newargconfig->at(i)->sectionName + "\n";
          }
          for (int x = 0; x < newargconfig->at(i)->arguments->size(); x++) {
              argument *arg = newargconfig->at(i)->arguments->at(x);
              md += "#### " + arg->argLong + "\n";
              md += arg->helpMessage + "\n\n";
              md += arg->additionalHelp + "\n\n";
              md += "    short: " + arg->argShort + " \n";
              md += "    long : " + arg->argLong + " \n\n";
              if (arg->numberOfArguments > 0)
                  md += "number of additional parameter: " + to_string(arg->numberOfArguments) + " \n \n ";
              if (arg->enums != "") {
                  md += "allowed parameter: " + arg->enums + "\n";
              }
              if (arg->requiredAndNotHitJet) {
                  md += "This argument is requires \n";
              }

          }
      }
    return md;
}